

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

pair<google::dense_hashtable_iterator<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_bool>
* __thiscall
google::
dense_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
::insert_noresize<HashObject<4,4>*,HashObject<4,4>*,int>
          (pair<google::dense_hashtable_iterator<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_bool>
           *__return_storage_ptr__,
          dense_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
          *this,HashObject<4,_4> **key,HashObject<4,_4> **args,int *args_1)

{
  long lVar1;
  long lVar2;
  unsigned_long uVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  
  pVar4 = find_position<HashObject<4,4>*>(this,key);
  uVar3 = pVar4.first;
  if (uVar3 == 0xffffffffffffffff) {
    insert_at<HashObject<4,4>*,int>(&__return_storage_ptr__->first,this,pVar4.second,args,args_1);
  }
  else {
    lVar1 = *(long *)(this + 0x40);
    lVar2 = *(long *)(this + 0x50);
    (__return_storage_ptr__->first).ht =
         (dense_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
          *)this;
    (__return_storage_ptr__->first).pos = (pointer)(uVar3 * 0x10 + lVar2);
    (__return_storage_ptr__->first).end = (pointer)(lVar1 * 0x10 + lVar2);
  }
  __return_storage_ptr__->second = uVar3 == 0xffffffffffffffff;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert_noresize(K&& key, Args&&... args) {
    // First, double-check we're not inserting delkey or emptyval
    assert(settings.use_empty() && "Inserting without empty key");
    assert(!equals(std::forward<K>(key), key_info.empty_key) && "Inserting the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) && "Inserting the deleted key");

    const std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return std::pair<iterator, bool>(
          iterator(this, table + pos.first, table + num_buckets, false),
          false);  // false: we didn't insert
    } else {       // pos.second says where to put it
      return std::pair<iterator, bool>(insert_at(pos.second, std::forward<Args>(args)...), true);
    }
  }